

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O3

void * get_sfnt_table(TT_Face face,FT_Sfnt_Tag tag)

{
  TT_OS2 *pTVar1;
  TT_PCLT *pTVar2;
  TT_OS2 *pTVar3;
  bool bVar4;
  
  switch(tag) {
  case FT_SFNT_HEAD:
    return &face->header;
  case FT_SFNT_MAXP:
    return &face->max_profile;
  case FT_SFNT_OS2:
    bVar4 = (face->os2).version == 0xffff;
    pTVar1 = &face->os2;
    break;
  case FT_SFNT_HHEA:
    return &face->horizontal;
  case FT_SFNT_VHEA:
    bVar4 = face->vertical_info == '\0';
    pTVar1 = (TT_OS2 *)&face->vertical;
    break;
  case FT_SFNT_POST:
    return &face->postscript;
  case FT_SFNT_PCLT:
    pTVar2 = &face->pclt;
    if ((face->pclt).Version == 0) {
      pTVar2 = (TT_PCLT *)0x0;
    }
    return pTVar2;
  default:
    return (void *)0x0;
  }
  pTVar3 = (TT_OS2 *)0x0;
  if (!bVar4) {
    pTVar3 = pTVar1;
  }
  return pTVar3;
}

Assistant:

static void*
  get_sfnt_table( TT_Face      face,
                  FT_Sfnt_Tag  tag )
  {
    void*  table;


    switch ( tag )
    {
    case FT_SFNT_HEAD:
      table = &face->header;
      break;

    case FT_SFNT_HHEA:
      table = &face->horizontal;
      break;

    case FT_SFNT_VHEA:
      table = face->vertical_info ? &face->vertical : NULL;
      break;

    case FT_SFNT_OS2:
      table = ( face->os2.version == 0xFFFFU ) ? NULL : &face->os2;
      break;

    case FT_SFNT_POST:
      table = &face->postscript;
      break;

    case FT_SFNT_MAXP:
      table = &face->max_profile;
      break;

    case FT_SFNT_PCLT:
      table = face->pclt.Version ? &face->pclt : NULL;
      break;

    default:
      table = NULL;
    }

    return table;
  }